

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> * __thiscall
testing::internal::ParameterizedTestCaseRegistry::
GetTestCasePatternHolder<gurkenlaeufer::detail::CucumberTest>
          (ParameterizedTestCaseRegistry *this,char *test_case_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *pPVar3;
  pointer ppPVar4;
  ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *local_78;
  CodeLocation local_70;
  CodeLocation local_48;
  
  ppPVar4 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppPVar4 ==
        (this->test_case_infos_).
        super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001548eb:
      pPVar3 = (ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *)operator_new(0x80);
      CodeLocation::CodeLocation(&local_70,code_location);
      ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::ParameterizedTestCaseInfo
                (pPVar3,test_case_name,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      local_78 = pPVar3;
      std::
      vector<testing::internal::ParameterizedTestCaseInfoBase*,std::allocator<testing::internal::ParameterizedTestCaseInfoBase*>>
      ::emplace_back<testing::internal::ParameterizedTestCaseInfoBase*>
                ((vector<testing::internal::ParameterizedTestCaseInfoBase*,std::allocator<testing::internal::ParameterizedTestCaseInfoBase*>>
                  *)this,(ParameterizedTestCaseInfoBase **)&local_78);
      return pPVar3;
    }
    iVar2 = (*(*ppPVar4)->_vptr_ParameterizedTestCaseInfoBase[2])();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar2),test_case_name);
    if (bVar1) {
      iVar2 = (*(*ppPVar4)->_vptr_ParameterizedTestCaseInfoBase[3])();
      if ((undefined1 *)CONCAT44(extraout_var_00,iVar2) !=
          &TypeIdHelper<gurkenlaeufer::detail::CucumberTest>::dummy_) {
        CodeLocation::CodeLocation(&local_48,code_location);
        ReportInvalidTestCaseType(test_case_name,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        abort();
      }
      pPVar3 = CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>,testing::internal::ParameterizedTestCaseInfoBase>
                         (*ppPVar4);
      if (pPVar3 != (ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *)0x0) {
        return pPVar3;
      }
      goto LAB_001548eb;
    }
    ppPVar4 = ppPVar4 + 1;
  } while( true );
}

Assistant:

ParameterizedTestCaseInfo<TestCase>* GetTestCasePatternHolder(
      const char* test_case_name,
      CodeLocation code_location) {
    ParameterizedTestCaseInfo<TestCase>* typed_test_info = NULL;
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      if ((*it)->GetTestCaseName() == test_case_name) {
        if ((*it)->GetTestCaseTypeId() != GetTypeId<TestCase>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test case setup and tear-down in this case.
          ReportInvalidTestCaseType(test_case_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestCaseInfo<TestCase> >(*it);
        }
        break;
      }
    }
    if (typed_test_info == NULL) {
      typed_test_info = new ParameterizedTestCaseInfo<TestCase>(
          test_case_name, code_location);
      test_case_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }